

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O1

int cuddGa(DdManager *table,int lower,int upper)

{
  size_t __size;
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  st__table *table_00;
  void *pvVar6;
  void *__s;
  double *__ptr;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  char *value;
  bool bVar20;
  double dVar21;
  int index;
  int *pointer;
  int local_74;
  ulong local_70;
  int local_64;
  double local_60;
  int local_54;
  DdManager *local_50;
  size_t local_48;
  long local_40;
  int *local_38;
  
  iVar3 = cuddSifting(table,lower,upper);
  if (iVar3 == 0) {
    return 0;
  }
  numvars = (upper - lower) + 1;
  uVar12 = 0x78;
  if (numvars * 3 < 0x78) {
    uVar12 = numvars * 3;
  }
  if (table->populationSize != 0) {
    uVar12 = table->populationSize;
  }
  uVar7 = 4;
  if (4 < (int)uVar12) {
    uVar7 = uVar12;
  }
  popsize = uVar7;
  local_70 = (ulong)(uint)lower;
  piVar5 = (int *)malloc((long)(int)(((upper - lower) + 2) * (uVar7 + 2)) << 2);
  storedd = piVar5;
  if (piVar5 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  repeat = (int *)malloc((ulong)uVar7 * 4);
  if (repeat == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    free(piVar5);
    storedd = (int *)0x0;
    return 0;
  }
  memset(repeat,0,(ulong)uVar7 << 2);
  table_00 = st__init_table(array_compare,array_hash);
  piVar5 = storedd;
  computed = table_00;
  if (table_00 == (st__table *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    iVar3 = 0;
LAB_007807c4:
    if (repeat != (int *)0x0) {
      free(repeat);
      repeat = (int *)0x0;
    }
  }
  else {
    lVar8 = (long)numvars;
    iVar3 = (int)local_70;
    if (0 < lVar8) {
      piVar2 = table->invperm;
      lVar16 = 0;
      do {
        piVar5[lVar16] = piVar2[iVar3 + lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar8 != lVar16);
    }
    piVar5 = storedd;
    storedd[lVar8] = table->keys - table->isolated;
    iVar4 = st__insert(table_00,(char *)piVar5,(char *)0x0);
    if (iVar4 != -10000) {
      *repeat = *repeat + 1;
      piVar5 = storedd;
      lVar8 = (long)numvars;
      if (0 < lVar8) {
        iVar4 = numvars * 2;
        piVar2 = table->invperm;
        lVar16 = 0;
        do {
          piVar5[iVar4] = piVar2[iVar3 + lVar16];
          lVar16 = lVar16 + 1;
          iVar4 = iVar4 + -1;
        } while (lVar8 != lVar16);
      }
      pvVar6 = malloc(lVar8 << 2);
      if (pvVar6 == (void *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (2 < popsize) {
          iVar3 = 2;
          do {
            if (0 < (long)numvars) {
              iVar4 = 0;
              memset(pvVar6,0,(long)numvars << 2);
              do {
                do {
                  lVar16 = (long)numvars;
                  lVar8 = Cudd_Random();
                  lVar8 = lVar8 % lVar16;
                } while (*(int *)((long)pvVar6 + lVar8 * 4) != 0);
                *(undefined4 *)((long)pvVar6 + lVar8 * 4) = 1;
                iVar15 = numvars;
                storedd[(numvars + 1) * iVar3 + iVar4] = table->invperm[(int)local_70 + (int)lVar8];
                iVar4 = iVar4 + 1;
              } while (iVar4 < iVar15);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < popsize);
        }
        free(pvVar6);
      }
      if (pvVar6 != (void *)0x0) {
        if (1 < popsize) {
          value = (char *)0x1;
          lVar8 = 4;
          do {
            iVar4 = (int)value;
            iVar3 = build_dd(table,iVar4,(int)local_70,upper);
            if (iVar3 == 0) goto LAB_00780eb8;
            iVar3 = st__lookup_int(computed,(char *)(storedd + (long)iVar4 * ((long)numvars + 1)),
                                   &local_74);
            if (iVar3 == 0) {
              iVar3 = st__insert(computed,(char *)(storedd + (long)iVar4 * ((long)numvars + 1)),
                                 value);
              if (iVar3 == -10000) goto LAB_00780eb8;
              piVar5 = (int *)((long)repeat + lVar8);
            }
            else {
              piVar5 = repeat + local_74;
            }
            *piVar5 = *piVar5 + 1;
            value = value + 1;
            lVar8 = lVar8 + 4;
          } while ((long)value < (long)popsize);
        }
        find_best();
        cross = table->numberXovers;
        if (table->numberXovers == 0) {
          cross = 0x3c;
          if (numvars * 3 < 0x3c) {
            cross = numvars * 3;
          }
        }
        iVar3 = (int)local_70;
        if (0 < cross) {
          iVar4 = 0;
          local_64 = upper;
          local_50 = table;
          do {
            iVar3 = table->size;
            __size = (long)iVar3 * 4;
            pvVar6 = malloc(__size);
            if (pvVar6 == (void *)0x0) {
LAB_00780f24:
              local_50->errorCode = CUDD_MEMORY_OUT;
              goto LAB_00780eb8;
            }
            local_54 = iVar4;
            __s = malloc(__size);
            iVar15 = popsize;
            if (__s == (void *)0x0) {
LAB_00780f1c:
              free(pvVar6);
              goto LAB_00780f24;
            }
            lVar8 = (long)popsize;
            local_48 = __size;
            local_40 = (long)iVar3;
            __ptr = (double *)malloc(lVar8 * 8);
            piVar5 = storedd;
            if (__ptr != (double *)0x0) {
              lVar16 = (long)numvars;
              *__ptr = 1.0 / (double)storedd[lVar16];
              if (1 < iVar15) {
                dVar21 = *__ptr;
                piVar5 = piVar5 + lVar16 * 2 + 1;
                lVar14 = 1;
                do {
                  dVar21 = dVar21 + 1.0 / (double)*piVar5;
                  __ptr[lVar14] = dVar21;
                  lVar14 = lVar14 + 1;
                  piVar5 = piVar5 + lVar16 + 1;
                } while (lVar8 != lVar14);
              }
              local_60 = __ptr[lVar16 + -1];
              lVar8 = Cudd_Random();
              uVar18 = 0;
              if (0 < popsize) {
                do {
                  if (((double)lVar8 * local_60) / 2147483561.0 <= __ptr[uVar18]) goto LAB_00780a32;
                  uVar18 = uVar18 + 1;
                } while ((uint)popsize != uVar18);
                uVar18 = (ulong)(uint)popsize;
              }
LAB_00780a32:
              do {
                upper = (int)uVar18;
                local_60 = __ptr[(long)popsize + -1];
                lVar8 = Cudd_Random();
                uVar9 = 0;
                if (0 < popsize) {
                  do {
                    if (((double)lVar8 * local_60) / 2147483561.0 <= __ptr[uVar9])
                    goto LAB_00780a83;
                    uVar9 = uVar9 + 1;
                  } while ((uint)popsize != uVar9);
                  uVar9 = (ulong)(uint)popsize;
                }
LAB_00780a83:
                iVar4 = (int)uVar9;
              } while (iVar4 == upper);
              free(__ptr);
            }
            if (__ptr == (double *)0x0) {
              free(pvVar6);
              pvVar6 = __s;
              goto LAB_00780f1c;
            }
            lVar16 = (long)numvars;
            lVar8 = Cudd_Random();
            do {
              lVar11 = (long)numvars;
              lVar14 = Cudd_Random();
              uVar18 = lVar14 % lVar11;
            } while (lVar8 % lVar16 == uVar18);
            if (0 < (int)local_40) {
              memset(pvVar6,0xff,local_48);
              memset(__s,0xff,local_48);
            }
            piVar5 = storedd;
            iVar3 = numvars + 1;
            iVar17 = popsize * iVar3;
            iVar15 = popsize + 1;
            uVar7 = numvars - 1;
            uVar19 = (uint)(lVar8 % lVar16);
            uVar12 = uVar19;
            do {
              iVar13 = piVar5[(int)(uVar12 + iVar3 * iVar4)];
              piVar5[(int)(uVar12 + iVar17)] = iVar13;
              *(uint *)((long)pvVar6 + (long)iVar13 * 4) = uVar12;
              iVar13 = piVar5[(int)(uVar12 + iVar3 * upper)];
              piVar5[(int)(uVar12 + iVar15 * iVar3)] = iVar13;
              *(uint *)((long)__s + (long)iVar13 * 4) = uVar12;
              piVar2 = storedd;
              bVar20 = uVar12 == uVar7;
              uVar12 = uVar12 + 1;
              if (bVar20) {
                uVar12 = 0;
              }
            } while (uVar12 != (uint)uVar18);
            iVar3 = numvars + 1;
            iVar13 = popsize * iVar3;
            iVar17 = popsize + 1;
            iVar15 = numvars + -1;
            do {
              iVar10 = (int)uVar18;
              uVar9 = uVar18 & 0xffffffff;
              do {
                iVar1 = piVar2[(int)uVar9 + upper * iVar3];
                uVar12 = *(uint *)((long)pvVar6 + (long)iVar1 * 4);
                uVar9 = (ulong)uVar12;
              } while (uVar12 != 0xffffffff);
              piVar2[iVar13 + iVar10] = iVar1;
              *(int *)((long)pvVar6 + (long)iVar1 * 4) = iVar10;
              uVar18 = uVar18 & 0xffffffff;
              do {
                iVar1 = piVar2[(int)uVar18 + iVar4 * iVar3];
                uVar12 = *(uint *)((long)__s + (long)iVar1 * 4);
                uVar18 = (ulong)uVar12;
              } while (uVar12 != 0xffffffff);
              piVar2[iVar17 * iVar3 + iVar10] = iVar1;
              *(int *)((long)__s + (long)iVar1 * 4) = iVar10;
              uVar12 = iVar10 + 1;
              if (iVar10 == iVar15) {
                uVar12 = 0;
              }
              uVar18 = (ulong)uVar12;
            } while (uVar12 != uVar19);
            free(pvVar6);
            free(__s);
            table = local_50;
            iVar3 = (int)local_70;
            iVar4 = popsize;
            upper = local_64;
            do {
              iVar15 = build_dd(table,iVar4,iVar3,upper);
              upper = local_64;
              if (iVar15 == 0) goto LAB_00780eb8;
              uVar18 = 0;
              do {
                uVar9 = uVar18;
                uVar18 = uVar9 + 1;
              } while (1 < repeat[uVar9]);
              large = (int)uVar9;
              iVar15 = (int)(uVar9 + 1);
              if (iVar15 < popsize) {
                lVar16 = (long)numvars;
                piVar5 = storedd + lVar16 + (lVar16 + 1) * (long)iVar15;
                lVar8 = 0;
                do {
                  if (storedd[(int)uVar9 * (int)(lVar16 + 1) + lVar16] <= *piVar5) {
                    uVar9 = uVar9 & 0xffffffff;
                    if (repeat[iVar15 + lVar8] < 2) {
                      uVar9 = (ulong)(uint)(iVar15 + (int)lVar8);
                    }
                  }
                  large = (int)uVar9;
                  lVar8 = lVar8 + 1;
                  piVar5 = piVar5 + lVar16 + 1;
                } while (popsize - iVar15 != (int)lVar8);
              }
              iVar15 = (numvars + 1) * large;
              if (storedd[(numvars + 1) * iVar4 + numvars] < storedd[numvars + iVar15]) {
                iVar15 = st__lookup_int(computed,(char *)(storedd + iVar15),&local_74);
                piVar5 = repeat;
                if (iVar15 == 0) goto LAB_00780eb8;
                repeat[local_74] = repeat[local_74] + -1;
                if (piVar5[local_74] == 0) {
                  local_38 = storedd + ((long)numvars + 1) * (long)local_74;
                  iVar15 = st__delete(computed,(char **)&local_38,(char **)0x0);
                  if (iVar15 == 0) goto LAB_00780eb8;
                }
                piVar5 = storedd;
                lVar8 = (long)numvars;
                if (-1 < lVar8) {
                  uVar18 = lVar8 + 1;
                  lVar16 = (long)large;
                  uVar9 = 0;
                  do {
                    piVar5[lVar16 * uVar18 + uVar9] = piVar5[(long)(iVar4 * (int)uVar18) + uVar9];
                    uVar9 = uVar9 + 1;
                  } while ((uVar18 & 0xffffffff) != uVar9);
                }
                piVar5 = &local_74;
                iVar15 = st__lookup_int(computed,(char *)(storedd + (lVar8 + 1) * (long)large),
                                        piVar5);
                if (iVar15 == 0) {
                  iVar15 = st__insert(computed,(char *)(storedd + ((long)numvars + 1) * (long)large)
                                      ,(char *)(long)large);
                  piVar5 = &large;
                  if (iVar15 == -10000) goto LAB_00780eb8;
                }
                repeat[*piVar5] = repeat[*piVar5] + 1;
              }
              bVar20 = iVar4 <= popsize;
              iVar4 = iVar4 + 1;
            } while (bVar20);
            iVar4 = local_54 + 1;
          } while (iVar4 < cross);
        }
        iVar4 = find_best();
        st__free_table(computed);
        computed = (st__table *)0x0;
        iVar3 = build_dd(table,iVar4,iVar3,upper);
        if (storedd != (int *)0x0) {
          free(storedd);
          storedd = (int *)0x0;
        }
        goto LAB_007807c4;
      }
      table->errorCode = CUDD_MEMORY_OUT;
    }
LAB_00780eb8:
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    if (repeat != (int *)0x0) {
      free(repeat);
      repeat = (int *)0x0;
    }
    st__free_table(computed);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
cuddGa(
  DdManager * table /* manager */,
  int  lower /* lowest level to be reordered */,
  int  upper /* highest level to be reorderded */)
{
    int         i,n,m;          /* dummy/loop vars */
    int         index;
#ifdef DD_STATS
    double      average_fitness;
#endif
    int         small;          /* index of smallest DD in population */

    /* Do an initial sifting to produce at least one reasonable individual. */
    if (!cuddSifting(table,lower,upper)) return(0);

    /* Get the initial values. */
    numvars = upper - lower + 1; /* number of variables to be reordered */
    if (table->populationSize == 0) {
        popsize = 3 * numvars;  /* population size is 3 times # of vars */
        if (popsize > 120) {
            popsize = 120;      /* Maximum population size is 120 */
        }
    } else {
        popsize = table->populationSize;  /* user specified value */
    }
    if (popsize < 4) popsize = 4;       /* enforce minimum population size */

    /* Allocate population table. */
    storedd = ABC_ALLOC(int,(popsize+2)*(numvars+1));
    if (storedd == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    /* Initialize the computed table. This table is made up of two data
    ** structures: A hash table with the key given by the order, which says
    ** if a given order is present in the population; and the repeat
    ** vector, which says how many copies of a given order are stored in
    ** the population table. If there are multiple copies of an order, only
    ** one has a repeat count greater than 1. This copy is the one pointed
    ** by the computed table.
    */
    repeat = ABC_ALLOC(int,popsize);
    if (repeat == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        return(0);
    }
    for (i = 0; i < popsize; i++) {
        repeat[i] = 0;
    }
    computed = st__init_table(array_compare,array_hash);
    if (computed == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        return(0);
    }

    /* Copy the current DD and its size to the population table. */
    for (i = 0; i < numvars; i++) {
        STOREDD(0,i) = table->invperm[i+lower]; /* order of initial DD */
    }
    STOREDD(0,numvars) = table->keys - table->isolated; /* size of initial DD */

    /* Store the initial order in the computed table. */
    if ( st__insert(computed,(char *)storedd,(char *) 0) == st__OUT_OF_MEM) {
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    repeat[0]++;

    /* Insert the reverse order as second element of the population. */
    for (i = 0; i < numvars; i++) {
        STOREDD(1,numvars-1-i) = table->invperm[i+lower]; /* reverse order */
    }

    /* Now create the random orders. make_random fills the population
    ** table with random permutations. The successive loop builds and sifts
    ** the DDs for the reverse order and each random permutation, and stores
    ** the results in the computed table.
    */
    if (!make_random(table,lower)) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    for (i = 1; i < popsize; i++) {
        result = build_dd(table,i,lower,upper); /* build and sift order */
        if (!result) {
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        if ( st__lookup_int(computed,(char *)&STOREDD(i,0),&index)) {
            repeat[index]++;
        } else {
            if ( st__insert(computed,(char *)&STOREDD(i,0),(char *)(long)i) ==
            st__OUT_OF_MEM) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            repeat[i]++;
        }
    }

#if 0
#ifdef DD_STATS
    /* Print the initial population. */
    (void) fprintf(table->out,"Initial population after sifting\n");
    for (m = 0; m < popsize; m++) {
        for (i = 0; i < numvars; i++) {
            (void) fprintf(table->out," %2d",STOREDD(m,i));
        }
        (void) fprintf(table->out," : %3d (%d)\n",
                       STOREDD(m,numvars),repeat[m]);
    }
#endif
#endif

    small = find_best();
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nInitial population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Decide how many crossovers should be tried. */
    if (table->numberXovers == 0) {
        cross = 3*numvars;
        if (cross > 60) {       /* do a maximum of 50 crossovers */
            cross = 60;
        }
    } else {
        cross = table->numberXovers;      /* use user specified value */
    }

    /* Perform the crossovers to get the best order. */
    for (m = 0; m < cross; m++) {
        if (!PMX(table->size)) {        /* perform one crossover */
            table->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        /* The offsprings are left in the last two entries of the
        ** population table. These are now considered in turn.
        */
        for (i = popsize; i <= popsize+1; i++) {
            result = build_dd(table,i,lower,upper); /* build and sift child */
            if (!result) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            large = largest();  /* find the largest DD in population */

            /* If the new child is smaller than the largest DD in the current
            ** population, enter it into the population in place of the
            ** largest DD.
            */
            if (STOREDD(i,numvars) < STOREDD(large,numvars)) {
                /* Look up the largest DD in the computed table.
                ** Decrease its repetition count. If the repetition count
                ** goes to 0, remove the largest DD from the computed table.
                */
                result = st__lookup_int(computed,(char *)&STOREDD(large,0),
                                       &index);
                if (!result) {
                    ABC_FREE(storedd);
                    ABC_FREE(repeat);
                    st__free_table(computed);
                    return(0);
                }
                repeat[index]--;
                if (repeat[index] == 0) {
                    int *pointer = &STOREDD(index,0);
                    result = st__delete(computed, (const char **)&pointer, NULL);
                    if (!result) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                }
                /* Copy the new individual to the entry of the
                ** population table just made available and update the
                ** computed table.
                */
                for (n = 0; n <= numvars; n++) {
                    STOREDD(large,n) = STOREDD(i,n);
                }
                if ( st__lookup_int(computed,(char *)&STOREDD(large,0),
                                  &index)) {
                    repeat[index]++;
                } else {
                    if ( st__insert(computed,(char *)&STOREDD(large,0),
                    (char *)(long)large) == st__OUT_OF_MEM) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                    repeat[large]++;
                }
            }
        }
    }

    /* Find the smallest DD in the population and build it;
    ** that will be the result.
    */
    small = find_best();

    /* Print stats on the final population. */
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nFinal population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Clean up, build the result DD, and return. */
    st__free_table(computed);
    computed = NULL;
    result = build_dd(table,small,lower,upper);
    ABC_FREE(storedd);
    ABC_FREE(repeat);
    return(result);

}